

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gencnvex.c
# Opt level: O0

NewConverter * CnvExtOpen(UCMFile *ucm)

{
  NewConverter *__s;
  CnvExtData *extData;
  UCMFile *ucm_local;
  
  __s = (NewConverter *)uprv_malloc_63(0xe0080);
  if (__s == (NewConverter *)0x0) {
    printf("out of memory\n");
    exit(7);
  }
  memset(__s,0,0xe0080);
  __s[1].close = (_func_void_NewConverter_ptr *)ucm;
  __s->close = CnvExtClose;
  __s->isValid = CnvExtIsValid;
  __s->addTable = CnvExtAddTable;
  __s->write = CnvExtWrite;
  return __s;
}

Assistant:

NewConverter *
CnvExtOpen(UCMFile *ucm) {
    CnvExtData *extData;
    
    extData=(CnvExtData *)uprv_malloc(sizeof(CnvExtData));
    if(extData==NULL) {
        printf("out of memory\n");
        exit(U_MEMORY_ALLOCATION_ERROR);
    }
    uprv_memset(extData, 0, sizeof(CnvExtData));

    extData->ucm=ucm; /* aliased, not owned */

    extData->newConverter.close=CnvExtClose;
    extData->newConverter.isValid=CnvExtIsValid;
    extData->newConverter.addTable=CnvExtAddTable;
    extData->newConverter.write=CnvExtWrite;
    return &extData->newConverter;
}